

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O0

void __thiscall PolicyPureVector::SetIndex(PolicyPureVector *this,LIndex i)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  PolicyDomainCategory PVar3;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems_00;
  size_t sVar4;
  Interface_ProblemToPolicyDiscretePure *pIVar5;
  value_type vVar6;
  reference pvVar7;
  ulong uVar8;
  value_type in_RSI;
  PolicyDiscrete *in_RDI;
  undefined1 auVar9 [16];
  int o;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> indexVec;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  int nrA;
  int nrO;
  Index in_stack_fffffffffffffef8;
  Index in_stack_fffffffffffffefc;
  double in_stack_ffffffffffffff00;
  PolicyPureVector *this_00;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__x;
  int in_stack_ffffffffffffff10;
  Index in_stack_ffffffffffffff14;
  size_type in_stack_ffffffffffffff18;
  undefined8 uVar10;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffff20;
  uint uVar11;
  undefined1 local_80 [80];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_30;
  int local_18;
  int local_14;
  value_type local_10;
  
  local_10 = in_RSI;
  nrElems_00 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               PolicyDiscretePure::GetInterfacePTPDiscretePure
                         ((PolicyDiscretePure *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  uVar11 = *(uint *)&in_RDI->field_0x34;
  PVar3 = PolicyDiscrete::GetPolicyDomainCategory(in_RDI);
  sVar4 = Policy::GetDepth(&in_RDI->super_Policy);
  local_14 = (*(_func_int *)
               (nrElems_00->
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
               super__Vector_impl_data._M_start[5])(nrElems_00,(ulong)uVar11,(ulong)PVar3,sVar4);
  pIVar5 = PolicyDiscretePure::GetInterfacePTPDiscretePure
                     ((PolicyDiscretePure *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  local_18 = (*(pIVar5->super_Interface_ProblemToPolicyDiscrete).
               _vptr_Interface_ProblemToPolicyDiscrete[4])
                       (pIVar5,(ulong)*(uint *)&in_RDI->field_0x34);
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x9848d7);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x984900);
  auVar9._0_8_ = std::pow<double,int>(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  auVar9._8_8_ = 0;
  vVar6 = vcvttsd2usi_avx512f(auVar9);
  pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&local_30,0);
  *pvVar7 = vVar6;
  vVar6 = (value_type)local_18;
  pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (&local_30,1);
  *pvVar7 = vVar6;
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x984982);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x9849a8);
  local_80._24_4_ = local_14;
  while (local_80._24_4_ = local_80._24_4_ + -1, -1 < (int)local_80._24_4_) {
    uVar8 = (ulong)local_14;
    uVar10 = 0;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (&local_30,0);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar8;
    auVar2._8_8_ = uVar10;
    auVar2._0_8_ = *pvVar7;
    *pvVar7 = SUB168(auVar2 / auVar1,0);
    IndexTools::JointToIndividualIndices(CONCAT44(PVar3,uVar11),nrElems_00);
    __x = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)(local_80 + 0x20);
    this_00 = (PolicyPureVector *)local_80;
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator=
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),__x);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    in_stack_ffffffffffffff10 = local_80._24_4_;
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[](__x,1)
    ;
    in_stack_ffffffffffffff14 = Globals::CastLIndexToIndex(*pvVar7);
    SetAction(this_00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    pvVar7 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        (local_80 + 0x20),0);
    local_10 = *pvVar7;
  }
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void PolicyPureVector::SetIndex(LIndex i)
{
    int nrO=GetInterfacePTPDiscretePure()->
        GetNrPolicyDomainElements(_m_agentI, 
                                  GetPolicyDomainCategory(),
                                  GetDepth()),
        nrA=GetInterfacePTPDiscretePure()->GetNrActions(_m_agentI);
    
    vector<LIndex> nrElems(2);
    nrElems[0]=static_cast<LIndex>(pow(static_cast<double>(nrA),nrO));
    nrElems[1]=nrA;
    vector<LIndex> indexVec(2);

    for(int o=nrO-1;o>=0;--o)
    {
        nrElems[0]/=nrO;
        indexVec=IndexTools::JointToIndividualIndices(i,nrElems);
        SetAction(o,CastLIndexToIndex(indexVec[1]));
        i=indexVec[0];
    }
}